

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subvq.c
# Opt level: O0

void subvq_map_linearize(subvq_t *vq)

{
  bool bVar1;
  int local_1c;
  int local_18;
  int32 s;
  int32 c;
  int32 r;
  subvq_t *vq_local;
  
  for (s = 0; s < (vq->origsize).r; s = s + 1) {
    local_18 = 0;
    while( true ) {
      bVar1 = false;
      if (local_18 < (vq->origsize).c) {
        bVar1 = -1 < *vq->map[s][local_18];
      }
      if (!bVar1) break;
      for (local_1c = 0; local_1c < vq->n_sv; local_1c = local_1c + 1) {
        vq->map[s][local_18][local_1c] = local_1c * vq->vqsize + vq->map[s][local_18][local_1c];
      }
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

static void
subvq_map_linearize(subvq_t * vq)
{
    int32 r, c, s;

    for (r = 0; r < vq->origsize.r; r++) {
        for (c = 0; (c < vq->origsize.c) && (vq->map[r][c][0] >= 0); c++) {
            for (s = 0; s < vq->n_sv; s++)
                vq->map[r][c][s] = (s * vq->vqsize) + vq->map[r][c][s];
        }
    }
}